

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constexpr_parser.h
# Opt level: O0

bool absl::str_format_internal::CheckFastPathSetting(UnboundConversion *conv)

{
  Flags FVar1;
  FILE *__stream;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  bool width_precision_needed;
  UnboundConversion *conv_local;
  
  iVar6 = UnboundConversion::InputValue::value(&conv->width);
  bVar8 = true;
  if (iVar6 < 0) {
    iVar6 = UnboundConversion::InputValue::value(&conv->precision);
    bVar8 = -1 < iVar6;
  }
  __stream = _stderr;
  if ((bVar8) && (conv->flags == kBasic)) {
    FVar1 = conv->flags;
    bVar8 = FlagsContains(conv->flags,kLeft);
    bVar2 = FlagsContains(conv->flags,kShowPos);
    bVar3 = FlagsContains(conv->flags,kSignCol);
    bVar4 = FlagsContains(conv->flags,kAlt);
    bVar5 = FlagsContains(conv->flags,kZero);
    iVar6 = UnboundConversion::InputValue::value(&conv->width);
    iVar7 = UnboundConversion::InputValue::value(&conv->precision);
    fprintf(__stream,
            "basic=%d left=%d show_pos=%d sign_col=%d alt=%d zero=%d width=%d precision=%d\n",
            (ulong)(FVar1 == kBasic),(ulong)bVar8,(ulong)bVar2,(ulong)bVar3,(uint)bVar4,(uint)bVar5,
            iVar6,iVar7);
    conv_local._7_1_ = false;
  }
  else {
    conv_local._7_1_ = true;
  }
  return conv_local._7_1_;
}

Assistant:

constexpr bool CheckFastPathSetting(const UnboundConversion& conv) {
  bool width_precision_needed =
      conv.width.value() >= 0 || conv.precision.value() >= 0;
  if (width_precision_needed && conv.flags == Flags::kBasic) {
#if defined(__clang__)
    // Some compilers complain about this in constexpr even when not executed,
    // so only enable the error dump in clang.
    fprintf(stderr,
            "basic=%d left=%d show_pos=%d sign_col=%d alt=%d zero=%d "
            "width=%d precision=%d\n",
            conv.flags == Flags::kBasic ? 1 : 0,
            FlagsContains(conv.flags, Flags::kLeft) ? 1 : 0,
            FlagsContains(conv.flags, Flags::kShowPos) ? 1 : 0,
            FlagsContains(conv.flags, Flags::kSignCol) ? 1 : 0,
            FlagsContains(conv.flags, Flags::kAlt) ? 1 : 0,
            FlagsContains(conv.flags, Flags::kZero) ? 1 : 0, conv.width.value(),
            conv.precision.value());
#endif  // defined(__clang__)
    return false;
  }
  return true;
}